

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall
anon_unknown.dwarf_24939c::ParameterPack::getSyntaxNode(ParameterPack *this,OutputStream *S)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Node *pNVar4;
  undefined4 extraout_var;
  ParameterPack *local_38;
  size_t Idx;
  OutputStream *S_local;
  ParameterPack *this_local;
  
  initializePackExpansion(this,S);
  uVar1 = S->CurrentPackIndex;
  sVar3 = NodeArray::size(&this->Data);
  local_38 = this;
  if (uVar1 < sVar3) {
    pNVar4 = NodeArray::operator[](&this->Data,(ulong)uVar1);
    iVar2 = (*pNVar4->_vptr_Node[3])(pNVar4,S);
    local_38 = (ParameterPack *)CONCAT44(extraout_var,iVar2);
  }
  return &local_38->super_Node;
}

Assistant:

const Node *getSyntaxNode(OutputStream &S) const override {
    initializePackExpansion(S);
    size_t Idx = S.CurrentPackIndex;
    return Idx < Data.size() ? Data[Idx]->getSyntaxNode(S) : this;
  }